

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

uint32_t spvtools::opt::anon_unknown_0::GetNumOfElementsContributedByOperand
                   (IRContext *context,Instruction *inst,uint32_t index)

{
  Op OVar1;
  uint32_t uVar2;
  int iVar3;
  DefUseManager *this;
  TypeManager *this_00;
  Type *pTVar4;
  undefined4 extraout_var;
  Instruction *this_01;
  undefined4 extraout_var_00;
  Vector *type;
  Instruction *def;
  uint32_t id;
  Vector *result_type;
  TypeManager *type_mgr;
  DefUseManager *def_use_mgr;
  uint32_t index_local;
  Instruction *inst_local;
  IRContext *context_local;
  
  OVar1 = opt::Instruction::opcode(inst);
  if (OVar1 == OpCompositeConstruct) {
    this = IRContext::get_def_use_mgr(context);
    this_00 = IRContext::get_type_mgr(context);
    uVar2 = opt::Instruction::type_id(inst);
    pTVar4 = analysis::TypeManager::GetType(this_00,uVar2);
    iVar3 = (*pTVar4->_vptr_Type[0xd])();
    if (CONCAT44(extraout_var,iVar3) == 0) {
      context_local._4_4_ = 1;
    }
    else {
      uVar2 = opt::Instruction::GetSingleWordInOperand(inst,index);
      this_01 = analysis::DefUseManager::GetDef(this,uVar2);
      uVar2 = opt::Instruction::type_id(this_01);
      pTVar4 = analysis::TypeManager::GetType(this_00,uVar2);
      iVar3 = (*pTVar4->_vptr_Type[0xd])();
      if ((Vector *)CONCAT44(extraout_var_00,iVar3) == (Vector *)0x0) {
        context_local._4_4_ = 1;
      }
      else {
        context_local._4_4_ =
             analysis::Vector::element_count((Vector *)CONCAT44(extraout_var_00,iVar3));
      }
    }
    return context_local._4_4_;
  }
  __assert_fail("inst->opcode() == spv::Op::OpCompositeConstruct",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                ,0x62d,
                "uint32_t spvtools::opt::(anonymous namespace)::GetNumOfElementsContributedByOperand(IRContext *, const Instruction *, uint32_t)"
               );
}

Assistant:

uint32_t GetNumOfElementsContributedByOperand(IRContext* context,
                                              const Instruction* inst,
                                              uint32_t index) {
  assert(inst->opcode() == spv::Op::OpCompositeConstruct);
  analysis::DefUseManager* def_use_mgr = context->get_def_use_mgr();
  analysis::TypeManager* type_mgr = context->get_type_mgr();

  analysis::Vector* result_type =
      type_mgr->GetType(inst->type_id())->AsVector();
  if (result_type == nullptr) {
    // If the result of the OpCompositeConstruct is not a vector then every
    // operands corresponds to a single element in the result.
    return 1;
  }

  // If the result type is a vector then the operands are either scalars or
  // vectors. If it is a scalar, then it corresponds to a single element.  If it
  // is a vector, then each element in the vector will be an element in the
  // result.
  uint32_t id = inst->GetSingleWordInOperand(index);
  Instruction* def = def_use_mgr->GetDef(id);
  analysis::Vector* type = type_mgr->GetType(def->type_id())->AsVector();
  if (type == nullptr) {
    return 1;
  }
  return type->element_count();
}